

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

int PAL_fgetpos(PAL_FILE *f,PAL_fpos_t *pos)

{
  fprintf(_stderr,"] %s %s:%d","PAL_fgetpos",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
          ,0x2fe);
  fprintf(_stderr,(char *)0x0);
  return -1;
}

Assistant:

int
__cdecl
PAL_fgetpos (
    PAL_FILE   *f,
    PAL_fpos_t *pos
)
{
#ifdef __LINUX__
    // TODO: implement for Linux if required
    ASSERT(FALSE);
    return -1;
#else
    int    nRetVal = -1;
    fpos_t native_pos;

    PERF_ENTRY(fgetpos);
    ENTRY("fgetpos( f=%p, pos=%p )\n", f, pos);

    _ASSERTE(f != NULL);
    _ASSERTE(pos != NULL);

    if (pos) {
        native_pos = *pos;
        nRetVal = fgetpos (f->bsdFilePtr, &native_pos);
        *pos = native_pos;
    }
    else {
        ERROR ("Error: NULL pos pointer\n");
        errno = EINVAL;
    }

    LOGEXIT( "fgetpos returning error code %d, pos %d\n", nRetVal, pos ? *pos : 0);
    PERF_EXIT(fgetpos);
    return nRetVal;
#endif // __LINUX__
}